

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O2

Edge * __thiscall State::AddEdge(State *this,Rule *rule)

{
  Edge *edge;
  
  edge = (Edge *)operator_new(0x68);
  edge->implicit_deps_ = 0;
  edge->order_only_deps_ = 0;
  edge->implicit_outs_ = 0;
  (edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  edge->dyndep_ = (Node *)0x0;
  edge->env_ = (BindingEnv *)0x0;
  *(undefined8 *)((long)&edge->env_ + 7) = 0;
  edge->rule_ = rule;
  edge->pool_ = &kDefaultPool;
  edge->env_ = &this->bindings_;
  std::vector<Edge_*,_std::allocator<Edge_*>_>::push_back(&this->edges_,&edge);
  return edge;
}

Assistant:

Edge* State::AddEdge(const Rule* rule) {
  Edge* edge = new Edge();
  edge->rule_ = rule;
  edge->pool_ = &State::kDefaultPool;
  edge->env_ = &bindings_;
  edges_.push_back(edge);
  return edge;
}